

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall TcpServerImpl::Delete(TcpServerImpl *this)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  
  piVar4 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    do {
      close(*piVar4);
      piVar4 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar1 = piVar4 + 1;
      if (piVar1 != piVar3) {
        memmove(piVar4,piVar1,(long)piVar3 - (long)piVar1);
        piVar4 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3 + -1;
    } while (piVar3 + -1 != piVar4);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mtAcceptList);
  if (iVar2 == 0) {
    piVar4 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      do {
        shutdown(*piVar4,2);
        close(*(this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
        piVar4 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar1 = piVar4 + 1;
        if (piVar1 != piVar3) {
          memmove(piVar4,piVar1,(long)piVar3 - (long)piVar1);
          piVar4 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        (this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar3 + -1;
      } while (piVar3 + -1 != piVar4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtAcceptList);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void TcpServerImpl::Delete()
{
    while (m_vSock.size())
    {
        ::closesocket(m_vSock[0]);
        m_vSock.erase(begin(m_vSock));
    }

    lock_guard<mutex> lock(m_mtAcceptList);
    while (m_vSockAccept.size())
    {
        ::shutdown(m_vSockAccept[0], SD_BOTH);
        ::closesocket(m_vSockAccept[0]);
        m_vSockAccept.erase(begin(m_vSockAccept));
    }
}